

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

bool __thiscall
crnd::crn_unpacker::unpack_dxn
          (crn_unpacker *this,uint8 **pDst,uint32 row_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  symbol_codec *this_00;
  vector<crnd::crn_unpacker::block_buffer_element> *this_01;
  uint uVar1;
  unsigned_short *puVar2;
  byte bVar3;
  uint32 uVar4;
  uint uVar5;
  uint32 uVar6;
  uint8 *puVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint new_size;
  uint uVar13;
  long lVar14;
  uint uVar15;
  block_buffer_element *pbVar16;
  bool bVar17;
  uint local_c4;
  uint8 *local_a8;
  
  uVar1 = (this->m_alpha_endpoints).m_size;
  new_size = output_width + 1 & 0xfffffffe;
  this_01 = &this->m_block_buffer;
  if ((this->m_block_buffer).m_size < new_size) {
    vector<crnd::crn_unpacker::block_buffer_element>::resize(this_01,new_size);
  }
  this_00 = &this->m_codec;
  uVar9 = 0;
  uVar11 = 0;
  local_c4 = 0;
  uVar15 = 0;
  do {
    if ((this->m_pHeader->m_faces).m_buf[0] <= uVar9) {
      return true;
    }
    local_a8 = pDst[uVar9];
    for (uVar13 = 0; uVar13 != (output_height + 1 & 0xfffffffe); uVar13 = uVar13 + 1) {
      bVar17 = uVar13 < output_height;
      puVar7 = local_a8 + (long)(int)((row_pitch_in_bytes >> 2) + new_size * -4) * 4;
      uVar12 = 0;
      uVar8 = 0;
      for (lVar14 = 0; uVar10 = (uint)uVar11, (ulong)(output_width + 1 & 0xfffffffe) << 3 != lVar14;
          lVar14 = lVar14 + 8) {
        if (((uVar13 | uVar12) & 1) == 0) {
          uVar4 = symbol_codec::decode(this_00,&this->m_reference_encoding_dm);
          uVar11 = (ulong)uVar4;
          pbVar16 = (block_buffer_element *)((long)&this_01->m_p->endpoint_reference + lVar14);
LAB_001132a4:
          bVar3 = (byte)uVar11 & 3;
          pbVar16->endpoint_reference = (ushort)((byte)(uVar11 >> 2) & 3);
          uVar10 = (uint)(byte)((byte)uVar11 >> 4);
        }
        else {
          if ((uVar13 & 1) == 0) {
            pbVar16 = this_01->m_p + uVar8;
            goto LAB_001132a4;
          }
          pbVar16 = (block_buffer_element *)((long)&this_01->m_p->endpoint_reference + lVar14);
          bVar3 = (byte)pbVar16->endpoint_reference;
        }
        if (bVar3 == 1) {
          pbVar16->alpha0_endpoint_index = (uint16)uVar15;
          pbVar16->alpha1_endpoint_index = (uint16)local_c4;
        }
        else if (bVar3 == 0) {
          uVar4 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm + 1);
          uVar5 = 0;
          if (uVar1 <= uVar4 + uVar15) {
            uVar5 = uVar1;
          }
          uVar15 = (uVar4 + uVar15) - uVar5;
          pbVar16->alpha0_endpoint_index = (uint16)uVar15;
          uVar4 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm + 1);
          uVar5 = 0;
          if (uVar1 <= uVar4 + local_c4) {
            uVar5 = uVar1;
          }
          local_c4 = (uVar4 + local_c4) - uVar5;
          pbVar16->alpha1_endpoint_index = (uint16)local_c4;
        }
        else {
          uVar15 = (uint)pbVar16->alpha0_endpoint_index;
          local_c4 = (uint)pbVar16->alpha1_endpoint_index;
        }
        bVar17 = (bool)(bVar17 & uVar8 < output_width);
        uVar4 = symbol_codec::decode(this_00,this->m_selector_delta_dm + 1);
        uVar6 = symbol_codec::decode(this_00,this->m_selector_delta_dm + 1);
        if (bVar17) {
          puVar2 = (this->m_alpha_selectors).m_p;
          *(uint *)(local_a8 + lVar14 * 2) =
               CONCAT22(puVar2[uVar4 * 3],(this->m_alpha_endpoints).m_p[uVar15]);
          *(undefined4 *)(local_a8 + lVar14 * 2 + 4) =
               *(undefined4 *)(puVar2 + (ulong)(uVar4 * 3) + 1);
          *(uint *)(local_a8 + lVar14 * 2 + 8) =
               CONCAT22(puVar2[uVar6 * 3],(this->m_alpha_endpoints).m_p[local_c4]);
          *(undefined4 *)(local_a8 + lVar14 * 2 + 0xc) =
               *(undefined4 *)(puVar2 + (ulong)(uVar6 * 3) + 1);
        }
        uVar8 = uVar8 + 1;
        uVar12 = uVar12 + 1;
        puVar7 = puVar7 + 0x10;
        uVar11 = (ulong)uVar10;
      }
      local_a8 = puVar7;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

bool unpack_dxn(uint8** pDst, uint32 row_pitch_in_bytes, uint32 output_width, uint32 output_height) {
    const uint32 num_alpha_endpoints = m_alpha_endpoints.size();
    const uint32 width = (output_width + 1) & ~1;
    const uint32 height = (output_height + 1) & ~1;
    const int32 delta_pitch_in_dwords = (row_pitch_in_bytes >> 2) - (width << 2);

    if (m_block_buffer.size() < width)
      m_block_buffer.resize(width);

    uint32 alpha0_endpoint_index = 0;
    uint32 alpha1_endpoint_index = 0;
    uint8 reference_group = 0;

    for (uint32 f = 0; f < m_pHeader->m_faces; f++) {
      uint32* pData = (uint32*)pDst[f];
      for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords) {
        bool visible = y < output_height;
        for (uint32 x = 0; x < width; x++, pData += 4) {
          visible = visible && x < output_width;
          if (!(y & 1) && !(x & 1))
            reference_group = m_codec.decode(m_reference_encoding_dm);
          block_buffer_element &buffer = m_block_buffer[x];
          uint8 endpoint_reference;
          if (y & 1) {
            endpoint_reference = buffer.endpoint_reference;
          } else {
            endpoint_reference = reference_group & 3;
            reference_group >>= 2;
            buffer.endpoint_reference = reference_group & 3;
            reference_group >>= 2;
          }
          if (!endpoint_reference) {
            alpha0_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
            if (alpha0_endpoint_index >= num_alpha_endpoints)
              alpha0_endpoint_index -= num_alpha_endpoints;
            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
            alpha1_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
            if (alpha1_endpoint_index >= num_alpha_endpoints)
              alpha1_endpoint_index -= num_alpha_endpoints;
            buffer.alpha1_endpoint_index = alpha1_endpoint_index;
          } else if (endpoint_reference == 1) {
            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
            buffer.alpha1_endpoint_index = alpha1_endpoint_index;
          } else {
            alpha0_endpoint_index = buffer.alpha0_endpoint_index;
            alpha1_endpoint_index = buffer.alpha1_endpoint_index;
          }
          uint32 alpha0_selector_index = m_codec.decode(m_selector_delta_dm[1]);
          uint32 alpha1_selector_index = m_codec.decode(m_selector_delta_dm[1]);
          if (visible) {
            const uint16* pAlpha0_selectors = &m_alpha_selectors[alpha0_selector_index * 3];
            const uint16* pAlpha1_selectors = &m_alpha_selectors[alpha1_selector_index * 3];
            pData[0] = m_alpha_endpoints[alpha0_endpoint_index] | (pAlpha0_selectors[0] << 16);
            pData[1] = pAlpha0_selectors[1] | (pAlpha0_selectors[2] << 16);
            pData[2] = m_alpha_endpoints[alpha1_endpoint_index] | (pAlpha1_selectors[0] << 16);
            pData[3] = pAlpha1_selectors[1] | (pAlpha1_selectors[2] << 16);
          }
        }
      }
    }
    return true;
  }